

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  ulong uVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  ulong uVar3;
  Descriptor *descriptor;
  UnknownFieldSet *this_01;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_30,&local_38);
  }
  descriptor = this->descriptor_;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError(descriptor,field,"SetRepeatedEnum",CPPTYPE_ENUM);
    descriptor = this->descriptor_;
  }
  if (*(int *)(*(long *)(descriptor + 0x10) + 0x3c) != 3) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      uVar3 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
      if ((uVar1 & 1) == 0) {
        this_01 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3));
      }
      else {
        this_01 = (UnknownFieldSet *)(uVar1 & 0xfffffffffffffffe);
      }
      UnknownFieldSet::AddVarint(this_01,*(int *)(field + 0x44),(long)value);
      return;
    }
  }
  SetRepeatedEnumValueInternal(this,message,field,index,value);
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValue(Message* message,
                                      const FieldDescriptor* field, int index,
                                      int value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetRepeatedEnumValueInternal(message, field, index, value);
}